

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

double __thiscall llvm::APInt::sqrt(APInt *this,double __x)

{
  bool bVar1;
  uint uVar2;
  uint64_t val;
  uint numBits;
  APInt *in_RSI;
  double dVar3;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  APInt x_old;
  APInt square;
  APInt nextSquare;
  APInt offset;
  APInt two;
  APInt midpoint;
  APInt x_new;
  APInt testy;
  APInt local_90;
  APInt local_80;
  APInt local_70;
  APInt local_60;
  APInt local_50;
  APInt local_40;
  
  uVar2 = getActiveBits(in_RSI);
  if (uVar2 < 6) {
    numBits = in_RSI->BitWidth;
    if (0x40 < numBits) {
      in_RSI = (APInt *)(in_RSI->U).VAL;
    }
    val = (uint64_t)""[(in_RSI->U).VAL];
  }
  else {
    numBits = in_RSI->BitWidth;
    if (0x33 < uVar2) {
      APInt(&testy,numBits,0x10,false);
      APInt(&x_old,in_RSI->BitWidth,1,false);
      APInt(&x_new,in_RSI->BitWidth,0,false);
      APInt(&two,in_RSI->BitWidth,2,false);
      uVar2 = 4;
      while ((uVar2 < numBits && (bVar1 = ule(in_RSI,&testy), !bVar1))) {
        uVar2 = uVar2 + 2;
        shl(&square,(uint)&testy);
        operator=(&testy,&square);
        ~APInt(&square);
      }
      shl(&square,(uint)&x_old);
      operator=(&x_old,&square);
      ~APInt(&square);
      while( true ) {
        udiv(&local_40,in_RSI);
        operator+((llvm *)&nextSquare,&local_40,&x_old);
        udiv(&square,&nextSquare);
        operator=(&x_new,&square);
        ~APInt(&square);
        ~APInt(&nextSquare);
        ~APInt(&local_40);
        bVar1 = ule(&x_old,&x_new);
        if (bVar1) break;
        operator=(&x_old,&x_new);
      }
      operator*(&square,&x_old);
      APInt(&local_50,&x_old);
      operator+((llvm *)&midpoint,&local_50,1);
      APInt(&local_60,&x_old);
      operator+((llvm *)&offset,&local_60,1);
      operator*(&nextSquare,&midpoint);
      ~APInt(&offset);
      ~APInt(&local_60);
      ~APInt(&midpoint);
      ~APInt(&local_50);
      bVar1 = ult(in_RSI,&square);
      if (bVar1) {
        this->BitWidth = x_old.BitWidth;
        this->U = x_old.U;
        x_old.BitWidth = 0;
      }
      else {
        bVar1 = ule(in_RSI,&nextSquare);
        if (!bVar1) {
          __assert_fail("this->ule(nextSquare) && \"Error in APInt::sqrt computation\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                        ,0x444,"APInt llvm::APInt::sqrt() const");
        }
        APInt(&local_70,&nextSquare);
        operator-((llvm *)&offset,&local_70,&square);
        udiv(&midpoint,&offset);
        ~APInt(&offset);
        ~APInt(&local_70);
        APInt(&local_80,in_RSI);
        operator-((llvm *)&offset,&local_80,&square);
        ~APInt(&local_80);
        bVar1 = ult(&offset,&midpoint);
        if (bVar1) {
          this->BitWidth = x_old.BitWidth;
          this->U = x_old.U;
          x_old.BitWidth = 0;
        }
        else {
          APInt(&local_90,&x_old);
          operator+((llvm *)this,&local_90,1);
          ~APInt(&local_90);
        }
        ~APInt(&offset);
        ~APInt(&midpoint);
      }
      ~APInt(&nextSquare);
      ~APInt(&square);
      ~APInt(&two);
      ~APInt(&x_new);
      ~APInt(&x_old);
      ~APInt(&testy);
      return extraout_XMM0_Qa_00;
    }
    if (0x40 < numBits) {
      in_RSI = (APInt *)(in_RSI->U).VAL;
    }
    dVar3 = round(SQRT(((double)CONCAT44(0x45300000,(int)((in_RSI->U).VAL >> 0x20)) -
                       1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)(in_RSI->U).VAL) - 4503599627370496.0)));
    val = (long)(dVar3 - 9.223372036854776e+18) & (long)dVar3 >> 0x3f | (long)dVar3;
  }
  APInt(this,numBits,val,false);
  return extraout_XMM0_Qa;
}

Assistant:

APInt APInt::sqrt() const {

  // Determine the magnitude of the value.
  unsigned magnitude = getActiveBits();

  // Use a fast table for some small values. This also gets rid of some
  // rounding errors in libc sqrt for small values.
  if (magnitude <= 5) {
    static const uint8_t results[32] = {
      /*     0 */ 0,
      /*  1- 2 */ 1, 1,
      /*  3- 6 */ 2, 2, 2, 2,
      /*  7-12 */ 3, 3, 3, 3, 3, 3,
      /* 13-20 */ 4, 4, 4, 4, 4, 4, 4, 4,
      /* 21-30 */ 5, 5, 5, 5, 5, 5, 5, 5, 5, 5,
      /*    31 */ 6
    };
    return APInt(BitWidth, results[ (isSingleWord() ? U.VAL : U.pVal[0]) ]);
  }

  // If the magnitude of the value fits in less than 52 bits (the precision of
  // an IEEE double precision floating point value), then we can use the
  // libc sqrt function which will probably use a hardware sqrt computation.
  // This should be faster than the algorithm below.
  if (magnitude < 52) {
    return APInt(BitWidth,
                 uint64_t(::round(::sqrt(double(isSingleWord() ? U.VAL
                                                               : U.pVal[0])))));
  }

  // Okay, all the short cuts are exhausted. We must compute it. The following
  // is a classical Babylonian method for computing the square root. This code
  // was adapted to APInt from a wikipedia article on such computations.
  // See http://www.wikipedia.org/ and go to the page named
  // Calculate_an_integer_square_root.
  unsigned nbits = BitWidth, i = 4;
  APInt testy(BitWidth, 16);
  APInt x_old(BitWidth, 1);
  APInt x_new(BitWidth, 0);
  APInt two(BitWidth, 2);

  // Select a good starting value using binary logarithms.
  for (;; i += 2, testy = testy.shl(2))
    if (i >= nbits || this->ule(testy)) {
      x_old = x_old.shl(i / 2);
      break;
    }

  // Use the Babylonian method to arrive at the integer square root:
  for (;;) {
    x_new = (this->udiv(x_old) + x_old).udiv(two);
    if (x_old.ule(x_new))
      break;
    x_old = x_new;
  }

  // Make sure we return the closest approximation
  // NOTE: The rounding calculation below is correct. It will produce an
  // off-by-one discrepancy with results from pari/gp. That discrepancy has been
  // determined to be a rounding issue with pari/gp as it begins to use a
  // floating point representation after 192 bits. There are no discrepancies
  // between this algorithm and pari/gp for bit widths < 192 bits.
  APInt square(x_old * x_old);
  APInt nextSquare((x_old + 1) * (x_old +1));
  if (this->ult(square))
    return x_old;
  assert(this->ule(nextSquare) && "Error in APInt::sqrt computation");
  APInt midpoint((nextSquare - square).udiv(two));
  APInt offset(*this - square);
  if (offset.ult(midpoint))
    return x_old;
  return x_old + 1;
}